

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void * setup_temp_malloc(vorb *f,int sz)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  undefined8 local_8;
  
  uVar1 = in_ESI + 7U & 0xfffffff8;
  if (*(long *)(in_RDI + 0x80) == 0) {
    local_8 = malloc((long)(int)uVar1);
  }
  else if ((int)(*(int *)(in_RDI + 0x94) - uVar1) < *(int *)(in_RDI + 0x90)) {
    local_8 = (void *)0x0;
  }
  else {
    *(uint *)(in_RDI + 0x94) = *(int *)(in_RDI + 0x94) - uVar1;
    local_8 = (void *)(*(long *)(in_RDI + 0x80) + (long)*(int *)(in_RDI + 0x94));
  }
  return local_8;
}

Assistant:

static void *setup_temp_malloc(vorb *f, int sz)
{
   sz = (sz+7) & ~7; // round up to nearest 8 for alignment of future allocs.
   if (f->alloc.alloc_buffer) {
      if (f->temp_offset - sz < f->setup_offset) return NULL;
      f->temp_offset -= sz;
      return (char *) f->alloc.alloc_buffer + f->temp_offset;
   }
   return malloc(sz);
}